

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void auto_recover_compact_ok_test(void)

{
  fdb_encryption_key *__s;
  size_t *psVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  fdb_kvs_handle *pfVar7;
  fdb_kvs_config *kvs_config_00;
  fdb_file_info *kvs_config_01;
  void *__s2;
  long lVar8;
  ulong uVar9;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar10;
  uint uVar11;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar12;
  char *pcVar13;
  fdb_file_info *info_00;
  fdb_kvs_handle *pfVar14;
  char *ptr_fhandle;
  undefined1 handle [8];
  fdb_kvs_handle *unaff_R12;
  __atomic_base<unsigned_long> unaff_R13;
  __atomic_base<unsigned_long> _Var15;
  filemgr *ptr_fhandle_00;
  fdb_config *pfVar16;
  ulong uVar17;
  btree *ptr_fhandle_01;
  fdb_doc **doc;
  timeval tVar18;
  timeval tVar19;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_new;
  fdb_file_handle *dbfile_new;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info info;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_15cd8;
  undefined1 auStack_15cd0 [16];
  undefined1 auStack_15cc0 [8];
  undefined1 auStack_15cb8 [80];
  ulong uStack_15c68;
  timeval tStack_15c48;
  fdb_file_info afStack_15c38 [3];
  fdb_file_info afStack_15b38 [3];
  fdb_config fStack_15a38;
  filemgr *pfStack_15940;
  fdb_kvs_handle *pfStack_15938;
  fdb_kvs_handle *pfStack_15930;
  fdb_config *pfStack_15928;
  fdb_kvs_handle *pfStack_15920;
  fdb_kvs_handle *pfStack_15918;
  fdb_file_handle *pfStack_15908;
  fdb_kvs_handle *pfStack_15900;
  timeval atStack_158f8 [2];
  timeval tStack_158d8;
  timeval tStack_158c8;
  undefined1 auStack_158b8 [70];
  undefined1 uStack_15872;
  undefined8 uStack_15868;
  filemgr *pfStack_157a8;
  fdb_kvs_handle *pfStack_157a0;
  fdb_kvs_handle *pfStack_15798;
  filemgr *pfStack_15790;
  fdb_kvs_handle *pfStack_15788;
  fdb_kvs_handle *pfStack_15780;
  undefined1 auStack_15770 [8];
  undefined1 auStack_15768 [8];
  undefined1 auStack_15760 [8];
  undefined1 auStack_15758 [16];
  undefined1 auStack_15748 [16];
  fdb_kvs_config fStack_15738;
  atomic<unsigned_long> aStack_15720;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15718;
  __atomic_base<unsigned_long> _Stack_15710;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15708;
  undefined1 auStack_15700 [8];
  undefined1 auStack_156f8 [16];
  undefined1 auStack_156e8 [16];
  atomic<unsigned_long> aStack_156d8;
  fdb_open_flags fStack_156c4;
  ushort uStack_156ba;
  filemgr *pfStack_156b0;
  atomic<unsigned_long> aStack_15670;
  undefined1 auStack_155f0 [16];
  timeval tStack_155e0;
  undefined1 auStack_155d0 [328];
  char acStack_15488 [256];
  char acStack_15388 [256];
  fdb_kvs_handle afStack_15288 [153];
  fdb_kvs_handle *pfStack_19c0;
  fdb_kvs_handle *pfStack_19b8;
  list *plStack_19b0;
  void *pvStack_19a8;
  fdb_kvs_config fStack_19a0;
  fdb_kvs_info fStack_1988;
  timeval tStack_1958;
  fdb_config fStack_1948;
  char acStack_1850 [256];
  fdb_kvs_handle afStack_1750 [2];
  fdb_kvs_handle **ppfStack_1228;
  fdb_kvs_handle *pfStack_1220;
  fdb_kvs_handle *pfStack_1218;
  fdb_kvs_config *pfStack_1210;
  fdb_kvs_handle *pfStack_1208;
  fdb_kvs_handle *pfStack_1200;
  undefined1 auStack_11e8 [16];
  undefined1 auStack_11d8 [32];
  fdb_kvs_handle *pfStack_11b8;
  fdb_kvs_config fStack_11b0;
  fdb_kvs_info fStack_1198;
  timeval tStack_1168;
  char acStack_1158 [256];
  undefined1 auStack_1058 [752];
  char acStack_d68 [256];
  fdb_kvs_handle fStack_c68;
  fdb_doc **ppfStack_a60;
  fdb_kvs_handle *pfStack_a58;
  undefined1 auStack_a40 [16];
  fdb_doc *pfStack_a30;
  fdb_kvs_handle *pfStack_a28;
  fdb_doc *apfStack_a20 [11];
  timeval tStack_9c8;
  undefined1 auStack_9b8 [536];
  char acStack_7a0 [256];
  stat sStack_6a0;
  fdb_config fStack_610;
  fdb_kvs_handle **ppfStack_518;
  fdb_kvs_handle *pfStack_510;
  fdb_kvs_handle *pfStack_508;
  fdb_kvs_handle *pfStack_500;
  btree *pbStack_4f8;
  fdb_kvs_handle *pfStack_4f0;
  fdb_kvs_handle *local_4e0;
  fdb_kvs_handle *local_4d8;
  fdb_file_handle *local_4d0;
  fdb_kvs_handle *local_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [40];
  fdb_file_info local_478;
  fdb_config local_430;
  btree local_338 [4];
  char local_238 [256];
  char local_138 [264];
  
  pfStack_4f0 = (fdb_kvs_handle *)0x10eb65;
  gettimeofday((timeval *)(local_4a0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_4f0 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_4f0 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_4f0 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar7 = (fdb_kvs_handle *)local_4a0;
  pfStack_4f0 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  local_430.buffercache_size = 0x1000000;
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.compaction_threshold = '\0';
  ptr_fhandle_01 = (btree *)&local_4d0;
  pfStack_4f0 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)ptr_fhandle_01,"./compact_test1",&local_430);
  ppfVar10 = &local_4e0;
  pfStack_4f0 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(local_4d0,ppfVar10,(fdb_kvs_config *)pfVar7);
  pfStack_4f0 = (fdb_kvs_handle *)0x10ebee;
  fVar2 = fdb_set_log_callback(local_4e0,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_4f0 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)local_4c0,"./compact_test1",&local_430);
    ppfVar10 = &local_4c8;
    pfStack_4f0 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default((fdb_file_handle *)local_4c0._0_8_,ppfVar10,(fdb_kvs_config *)local_4a0);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ec3d;
    fVar2 = fdb_set_log_callback(local_4c8,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_4f0 = (fdb_kvs_handle *)0x10ec60;
    sprintf(local_138,"key%d",0);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(local_238,"meta%d",0);
    ptr_fhandle_01 = local_338;
    pfStack_4f0 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)ptr_fhandle_01,"body%d",0);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ec9e;
    sVar4 = strlen(local_138);
    pfStack_4f0 = (fdb_kvs_handle *)0x10eca9;
    sVar5 = strlen(local_238);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ecb4;
    sVar6 = strlen((char *)ptr_fhandle_01);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(local_4c0 + 8),local_138,sVar4,local_238,sVar5,ptr_fhandle_01,sVar6)
    ;
    pfStack_4f0 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(local_4e0,(fdb_doc *)local_4c0._8_8_);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(local_138,"key%d",1);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(local_238,"meta%d",1);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)ptr_fhandle_01,"body%d",1);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ed2c;
    sVar4 = strlen(local_138);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ed37;
    sVar5 = strlen(local_238);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ed42;
    sVar6 = strlen((char *)ptr_fhandle_01);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(local_4c0 + 0x10),local_138,sVar4,local_238,sVar5,ptr_fhandle_01,
                   sVar6);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(local_4e0,(fdb_doc *)local_4c0._16_8_);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&local_4d8,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (local_4c0._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)local_4c0._16_8_,
                   *(btree_print_func **)(local_4c0._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(local_4c0._16_8_ + 8),
                   (void *)0x0,0);
    *(bool *)&local_4d8->file = true;
    pfStack_4f0 = (fdb_kvs_handle *)0x10edac;
    fdb_set(local_4e0,(fdb_doc *)local_4d8);
    pfStack_4f0 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)local_4d8);
    pfStack_4f0 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(local_4d0,'\x01');
    pfStack_4f0 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(local_4d0,"./compact_test2");
    pfStack_4f0 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_4f0 = (fdb_kvs_handle *)0x10edf7;
    sprintf(local_138,"key%d",2);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(local_238,"meta%d",2);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)ptr_fhandle_01,"body%d",2);
    unaff_R12 = (fdb_kvs_handle *)(local_4c0 + 0x18);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee30;
    unaff_R13._M_i = strlen(local_138);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee3b;
    unaff_RBP = (fdb_kvs_handle *)strlen(local_238);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee46;
    sVar4 = strlen((char *)ptr_fhandle_01);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)unaff_R12,local_138,unaff_R13._M_i,local_238,(size_t)unaff_RBP,
                   ptr_fhandle_01,sVar4);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(local_4e0,(fdb_doc *)local_4c0._24_8_);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(local_4d0,'\x01');
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(local_4e0);
    ppfVar10 = &local_4c8;
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(local_4c8);
    pfStack_4f0 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(local_4d0);
    pfVar7 = (fdb_kvs_handle *)local_4c0;
    pfStack_4f0 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)local_4c0._0_8_);
    pfStack_4f0 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_4f0 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar7,"./compact_test1",&local_430);
    pfStack_4f0 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default((fdb_file_handle *)local_4c0._0_8_,ppfVar10,(fdb_kvs_config *)local_4a0);
    pfStack_4f0 = (fdb_kvs_handle *)0x10eef5;
    fVar2 = fdb_set_log_callback(local_4c8,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar2 == FDB_RESULT_SUCCESS) {
      unaff_R13._M_i = 0;
      ppfVar10 = &local_4d8;
      while( true ) {
        pfStack_4f0 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar10,
                       (void *)(*(size_t **)(local_4c0 + unaff_R13._M_i * 8 + 8))[4],
                       **(size_t **)(local_4c0 + unaff_R13._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_4f0 = (fdb_kvs_handle *)0x10ef38;
        fVar2 = fdb_get(local_4c8,(fdb_doc *)local_4d8);
        pfVar14 = local_4d8;
        if ((fdb_kvs_handle *)unaff_R13._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_4f0 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar14);
        unaff_R13._M_i =
             (__int_type_conflict)&(((fdb_kvs_handle *)unaff_R13._M_i)->kvs_config).field_0x1;
        pfVar7 = pfVar14;
        if ((undefined1 *)unaff_R13._M_i == (undefined1 *)0x3) {
          pfStack_4f0 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)local_4c0._0_8_,&local_478);
          pfStack_4f0 = (fdb_kvs_handle *)0x10efd4;
          iVar3 = strcmp("./compact_test2",local_478.filename);
          if (iVar3 != 0) {
            pfStack_4f0 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_4f0 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(local_4c8);
          pfStack_4f0 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)local_4c0._0_8_);
          lVar8 = 0;
          do {
            pfStack_4f0 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(local_4c0 + lVar8 * 8 + 8));
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          pfStack_4f0 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_4f0 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar13 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar13 = "%s FAILED\n";
          }
          pfStack_4f0 = (fdb_kvs_handle *)0x10f046;
          fprintf(_stderr,pcVar13,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar2 == FDB_RESULT_SUCCESS) {
        ptr_fhandle_01 = local_4d8->staletree;
        unaff_RBP = *(fdb_kvs_handle **)(local_4c0 + unaff_R13._M_i * 8 + 8);
        unaff_R12 = (fdb_kvs_handle *)unaff_RBP->staletree;
        pfStack_4f0 = (fdb_kvs_handle *)0x10ef77;
        iVar3 = bcmp(ptr_fhandle_01,unaff_R12,(size_t)(local_4d8->kvs_config).custom_cmp);
        if (iVar3 == 0) {
          ptr_fhandle_01 = (pfVar14->field_6).seqtree;
          unaff_R12 = (fdb_kvs_handle *)(unaff_RBP->field_6).seqtree;
          pfStack_4f0 = (fdb_kvs_handle *)0x10ef96;
          iVar3 = bcmp(ptr_fhandle_01,unaff_R12,(size_t)(pfVar14->kvs_config).custom_cmp_param);
          if (iVar3 == 0) goto LAB_0010ef9e;
          pfStack_4f0 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar7 = pfVar14;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar14 = pfVar7;
        pfStack_4f0 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_4f0 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar7 = pfVar14;
LAB_0010f073:
      pfStack_4f0 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_4f0 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_4f0 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_4f0 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_a58 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_518 = ppfVar10;
  pfStack_510 = unaff_R12;
  pfStack_508 = (fdb_kvs_handle *)unaff_R13._M_i;
  pfStack_500 = pfVar7;
  pbStack_4f8 = ptr_fhandle_01;
  pfStack_4f0 = unaff_RBP;
  gettimeofday(&tStack_9c8,(__timezone_ptr_t)0x0);
  pfStack_a58 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_a58 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_a58 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar7 = (fdb_kvs_handle *)auStack_9b8;
  pfStack_a58 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_610.buffercache_size = 0x1000000;
  fStack_610.wal_threshold = 0x400;
  fStack_610.flags = 1;
  fStack_610.compaction_threshold = '\0';
  doc = &pfStack_a30;
  pfStack_a58 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)doc,"./compact_test1",&fStack_610);
  ptr_handle = (list *)(auStack_a40 + 8);
  pfStack_a58 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_a30,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar7);
  pfStack_a58 = (fdb_kvs_handle *)0x10f133;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_a40._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar9 = 0;
    do {
      pfStack_a58 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_7a0,"key%d",uVar9 & 0xffffffff);
      pfStack_a58 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_9b8 + 0x118,"meta%d",uVar9 & 0xffffffff);
      pfStack_a58 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_9b8 + 0x18,"body%d",uVar9 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_a20 + (long)unaff_R12);
      pfStack_a58 = (fdb_kvs_handle *)0x10f19b;
      unaff_R13._M_i = strlen(acStack_7a0);
      unaff_RBP = (fdb_kvs_handle *)(auStack_9b8 + 0x118);
      pfStack_a58 = (fdb_kvs_handle *)0x10f1ae;
      pfVar7 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      pfStack_a58 = (fdb_kvs_handle *)0x10f1be;
      sVar4 = strlen(auStack_9b8 + 0x18);
      pfStack_a58 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(doc,acStack_7a0,unaff_R13._M_i,unaff_RBP,(size_t)pfVar7,auStack_9b8 + 0x18,
                     sVar4);
      pfStack_a58 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_a40._8_8_,apfStack_a20[uVar9]);
      uVar9 = uVar9 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar9 != 10);
    pfStack_a58 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_a30,'\x01');
    pfStack_a58 = (fdb_kvs_handle *)0x10f226;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_a40._8_8_,&pfStack_a28,10);
    ptr_handle = (list *)0xa;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_a58 = (fdb_kvs_handle *)0x10f23f;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_a30,"./compact_test2");
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfVar7 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_a58 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_a40,apfStack_a20[(long)pfVar7]->key,
                       apfStack_a20[(long)pfVar7]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_a58 = (fdb_kvs_handle *)0x10f282;
        fVar2 = fdb_get((fdb_kvs_handle *)auStack_a40._8_8_,(fdb_doc *)auStack_a40._0_8_);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pfStack_a58 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_a58 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_a40._0_8_);
        pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
      } while (pfVar7 != (fdb_kvs_handle *)0xa);
      pfStack_a58 = (fdb_kvs_handle *)0x10f2b1;
      iVar3 = stat("./compact_test1",&sStack_6a0);
      if (iVar3 == 0) {
        pfStack_a58 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar7 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_a58 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_a40,apfStack_a20[(long)pfVar7]->key,
                       apfStack_a20[(long)pfVar7]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_a58 = (fdb_kvs_handle *)0x10f2f5;
        fVar2 = fdb_get(pfStack_a28,(fdb_doc *)auStack_a40._0_8_);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_a58 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_a40._0_8_);
        pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
        if (pfVar7 == (fdb_kvs_handle *)0xa) {
          pfStack_a58 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_a30);
          pfStack_a58 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar8 = 0;
          do {
            pfStack_a58 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_a20[lVar8]);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 10);
          pfStack_a58 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar13 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar13 = "%s FAILED\n";
          }
          pfStack_a58 = (fdb_kvs_handle *)0x10f36a;
          fprintf(_stderr,pcVar13,"unlink after compaction test");
          return;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_a40;
      pfStack_a58 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_a58 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_a58 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_a58 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_1200 = (fdb_kvs_handle *)0x10f3b5;
  fStack_c68.bub_ctx.entries = ptr_handle;
  fStack_c68.bub_ctx.num_entries = (uint64_t)unaff_R12;
  fStack_c68.bub_ctx.space_used = unaff_R13._M_i;
  fStack_c68.bub_ctx.handle = pfVar7;
  ppfStack_a60 = doc;
  pfStack_a58 = unaff_RBP;
  gettimeofday(&tStack_1168,(__timezone_ptr_t)0x0);
  pfStack_1200 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_1200 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1200 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config_00 = &fStack_11b0;
  pfStack_1200 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_1058._256_8_ = 0x1000000;
  auStack_1058._264_8_ = 0x400;
  auStack_1058._284_4_ = 1;
  auStack_1058[0x127] = 0;
  pfVar7 = (fdb_kvs_handle *)(auStack_11d8 + 0x18);
  pfStack_1200 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar7,"./compact_test1",(fdb_config *)(auStack_1058 + 0xf8));
  ppfVar10 = (fdb_kvs_handle **)(auStack_11d8 + 8);
  pfStack_1200 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_11d8._24_8_,ppfVar10,(char *)0x0,kvs_config_00);
  pfStack_1200 = (fdb_kvs_handle *)0x10f440;
  pfVar14 = (fdb_kvs_handle *)auStack_11d8._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d8._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar9 = 0;
    do {
      pfStack_1200 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_d68,"key%d",uVar9 & 0xffffffff);
      pfStack_1200 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_1058 + 0x1f0,"meta%d",uVar9 & 0xffffffff);
      pfStack_1200 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_1158,"body%d",uVar9 & 0xffffffff);
      pfVar7 = (fdb_kvs_handle *)(auStack_1058 + (long)unaff_R12);
      pfStack_1200 = (fdb_kvs_handle *)0x10f4ab;
      unaff_R13._M_i = strlen(acStack_d68);
      unaff_RBP = (fdb_kvs_handle *)(auStack_1058 + 0x1f0);
      pfStack_1200 = (fdb_kvs_handle *)0x10f4be;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)unaff_RBP);
      pfStack_1200 = (fdb_kvs_handle *)0x10f4ce;
      sVar4 = strlen(acStack_1158);
      pfStack_1200 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar7,acStack_d68,unaff_R13._M_i,unaff_RBP,(size_t)kvs_config_00,
                     acStack_1158,sVar4);
      pfStack_1200 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_11d8._8_8_,*(fdb_doc **)(auStack_1058 + uVar9 * 8));
      uVar9 = uVar9 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar9 != 0x1e);
    pfStack_1200 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_11d8._24_8_,'\0');
    pfStack_1200 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_11d8 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_1058 + 0xf8));
    ppfVar10 = (fdb_kvs_handle **)auStack_11e8;
    pfStack_1200 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_11d8._16_8_,ppfVar10,(char *)0x0,&fStack_11b0);
    pfStack_1200 = (fdb_kvs_handle *)0x10f56b;
    pfVar14 = (fdb_kvs_handle *)auStack_11e8._0_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_11e8._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar9 = 0;
    do {
      pfStack_1200 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_d68,"k2ey%d",uVar9 & 0xffffffff);
      pfStack_1200 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_1058 + 0x1f0,"m2eta%d",uVar9 & 0xffffffff);
      pfStack_1200 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_1158,"b2ody%d",uVar9 & 0xffffffff);
      pfVar7 = (fdb_kvs_handle *)(&fStack_c68.kvs_config.create_if_missing + (long)unaff_R12);
      pfStack_1200 = (fdb_kvs_handle *)0x10f5d6;
      unaff_R13._M_i = strlen(acStack_d68);
      unaff_RBP = (fdb_kvs_handle *)(auStack_1058 + 0x1f0);
      pfStack_1200 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)unaff_RBP);
      pfStack_1200 = (fdb_kvs_handle *)0x10f5f9;
      sVar4 = strlen(acStack_1158);
      pfStack_1200 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar7,acStack_d68,unaff_R13._M_i,unaff_RBP,(size_t)kvs_config_00,
                     acStack_1158,sVar4);
      pfStack_1200 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_11e8._0_8_,
              *(fdb_doc **)(&fStack_c68.kvs_config.create_if_missing + uVar9 * 8));
      uVar9 = uVar9 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar9 != 0x3c);
    pfStack_1200 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_11d8._16_8_,'\0');
    pfStack_1200 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_11e8._0_8_,&fStack_1198);
    if ((filemgr *)fStack_1198.last_seqnum != (filemgr *)0x3c) {
      pfStack_1200 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_1200 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_11e8._0_8_);
    pfStack_1200 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_11d8._16_8_);
    pfStack_1200 = (fdb_kvs_handle *)0x10f68c;
    pfVar14 = (fdb_kvs_handle *)auStack_11d8._24_8_;
    fVar2 = fdb_compact((fdb_file_handle *)auStack_11d8._24_8_,(char *)0x0);
    ppfVar10 = (fdb_kvs_handle **)0x3c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config_00 = (fdb_kvs_config *)(auStack_11d8 + 8);
    pfStack_1200 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_11d8._8_8_);
    pfVar7 = (fdb_kvs_handle *)(auStack_11d8 + 0x18);
    pfStack_1200 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_11d8._24_8_);
    pfStack_1200 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar7,"./compact_test1",(fdb_config *)(auStack_1058 + 0xf8));
    pfStack_1200 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_11d8._24_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_11b0);
    pfStack_1200 = (fdb_kvs_handle *)0x10f6ed;
    pfVar14 = (fdb_kvs_handle *)auStack_11d8._8_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_11d8._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar10 = (fdb_kvs_handle **)0x0;
    kvs_config_00 = (fdb_kvs_config *)(auStack_11e8 + 8);
    pfVar7 = (fdb_kvs_handle *)auStack_11d8;
    do {
      pfStack_1200 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config_00,
                     (void *)(*(size_t **)(auStack_1058 + (long)ppfVar10))[4],
                     **(size_t **)(auStack_1058 + (long)ppfVar10),(void *)0x0,0,(void *)0x0,0);
      pfStack_1200 = (fdb_kvs_handle *)0x10f737;
      pfVar14 = (fdb_kvs_handle *)auStack_11d8._8_8_;
      fVar2 = fdb_get((fdb_kvs_handle *)auStack_11d8._8_8_,(fdb_doc *)auStack_11e8._8_8_);
      pfVar12 = (fdb_kvs_handle *)auStack_11e8._8_8_;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_1200 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      unaff_R13._M_i = (__int_type_conflict)(auStack_1058 + (long)ppfVar10);
      unaff_R12 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)unaff_R13._M_i)->kvs_config;
      pfStack_1200 = (fdb_kvs_handle *)0x10f765;
      iVar3 = bcmp(*(btree **)(auStack_11e8._8_8_ + 0x38),unaff_R12->staletree,
                   (size_t)((fdb_kvs_config *)auStack_11e8._8_8_)->custom_cmp);
      if (iVar3 != 0) {
        pfStack_1200 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar12 = pfStack_11b8;
        unaff_R12 = (fdb_kvs_handle *)auStack_11d8._0_8_;
      }
      pfStack_1200 = (fdb_kvs_handle *)0x10f77b;
      iVar3 = bcmp((pfVar12->field_6).seqtree,(unaff_R12->field_6).seqtree,
                   (size_t)(pfVar12->kvs_config).custom_cmp_param);
      unaff_RBP = pfVar12;
      if (iVar3 != 0) {
        pfStack_1200 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        unaff_RBP = (fdb_kvs_handle *)auStack_11d8._0_8_;
      }
      pfStack_1200 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)unaff_RBP);
      ppfVar10 = ppfVar10 + 1;
    } while (ppfVar10 != (fdb_kvs_handle **)0xf0);
    pfStack_1200 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_11d8 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_1058 + 0xf8));
    kvs_config_00 = (fdb_kvs_config *)auStack_11e8;
    pfStack_1200 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_11d8._16_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_11b0);
    pfStack_1200 = (fdb_kvs_handle *)0x10f817;
    pfVar14 = (fdb_kvs_handle *)auStack_11e8._0_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_11e8._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1200 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_11e8._0_8_,&fStack_1198);
      if ((filemgr *)fStack_1198.last_seqnum != (filemgr *)0x3c) {
        pfStack_1200 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      unaff_RBP = (fdb_kvs_handle *)0x0;
      ppfVar10 = (fdb_kvs_handle **)(auStack_11e8 + 8);
      kvs_config_00 = (fdb_kvs_config *)auStack_11d8;
      while( true ) {
        psVar1 = *(size_t **)
                  (&fStack_c68.kvs_config.create_if_missing +
                  (long)&(unaff_RBP->kvs_config).create_if_missing);
        pfStack_1200 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar10,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
        pfStack_1200 = (fdb_kvs_handle *)0x10f884;
        pfVar14 = (fdb_kvs_handle *)auStack_11e8._0_8_;
        fVar2 = fdb_get((fdb_kvs_handle *)auStack_11e8._0_8_,(fdb_doc *)auStack_11e8._8_8_);
        pfVar12 = (fdb_kvs_handle *)auStack_11e8._8_8_;
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        unaff_R12 = (fdb_kvs_handle *)
                    (&fStack_c68.kvs_config.create_if_missing +
                    (long)&(unaff_RBP->kvs_config).create_if_missing);
        pfVar7 = *(fdb_kvs_handle **)&unaff_R12->kvs_config;
        pfStack_1200 = (fdb_kvs_handle *)0x10f8b1;
        iVar3 = bcmp(*(btree **)(auStack_11e8._8_8_ + 0x38),pfVar7->staletree,
                     (size_t)((fdb_kvs_config *)auStack_11e8._8_8_)->custom_cmp);
        if (iVar3 != 0) {
          pfStack_1200 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar12 = pfStack_11b8;
          pfVar7 = (fdb_kvs_handle *)auStack_11d8._0_8_;
        }
        pfStack_1200 = (fdb_kvs_handle *)0x10f8c6;
        iVar3 = bcmp((pfVar12->field_6).seqtree,(pfVar7->field_6).seqtree,
                     (size_t)(pfVar12->kvs_config).custom_cmp_param);
        unaff_R13._M_i = (__int_type_conflict)pfVar12;
        if (iVar3 != 0) {
          pfStack_1200 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          unaff_R13._M_i = auStack_11d8._0_8_;
        }
        pfStack_1200 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)unaff_R13._M_i);
        unaff_RBP = (fdb_kvs_handle *)&(unaff_RBP->kvs_config).custom_cmp;
        if (unaff_RBP == (fdb_kvs_handle *)0x1e0) {
          lVar8 = 0;
          do {
            pfStack_1200 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_1058 + lVar8 * 8));
            pfStack_1200 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_c68.kvs_config.create_if_missing + lVar8 * 8));
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x1e);
          lVar8 = 0;
          do {
            pfStack_1200 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_c68.config.encryption_key.bytes + lVar8 * 8 + -0x14));
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x1e);
          pfStack_1200 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_11d8._8_8_);
          pfStack_1200 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_11d8._24_8_);
          pfStack_1200 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_11e8._0_8_);
          pfStack_1200 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_11d8._16_8_);
          pfStack_1200 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_1200 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar13 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar13 = "%s FAILED\n";
          }
          pfStack_1200 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar13,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_1200 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_1200 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_1200 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_1200 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_1200 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_1200 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_1228 = ppfVar10;
  pfStack_1220 = unaff_R12;
  pfStack_1218 = (fdb_kvs_handle *)unaff_R13._M_i;
  pfStack_1210 = kvs_config_00;
  pfStack_1208 = pfVar7;
  pfStack_1200 = unaff_RBP;
  gettimeofday(&tStack_1958,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_1948.buffercache_size = 0;
  fStack_1948.wal_threshold = 0x400;
  fStack_1948.compaction_threshold = '\0';
  if (pfVar14 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var15._M_i = (__int_type_conflict)&pfStack_19c0;
    fVar2 = fdb_open((fdb_file_handle **)_Var15._M_i,"./compact_test1",&fStack_1948);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      _Var15._M_i = (__int_type_conflict)pfStack_19c0;
      fVar2 = fdb_kvs_open_default((fdb_file_handle *)pfStack_19c0,&pfStack_19b8,&fStack_19a0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar8 = 0;
      uVar9 = 0;
      do {
        __s = &afStack_1750[0].config.encryption_key;
        sprintf((char *)__s,"key%d",uVar9 & 0xffffffff);
        sprintf((char *)afStack_1750,"meta%d",uVar9 & 0xffffffff);
        sprintf(acStack_1850,"body%d",uVar9 & 0xffffffff);
        unaff_R13._M_i = strlen((char *)__s);
        unaff_RBP = afStack_1750;
        sVar4 = strlen((char *)unaff_RBP);
        sVar5 = strlen(acStack_1850);
        fdb_doc_create((fdb_doc **)((long)&afStack_1750[0].bub_ctx.handle + lVar8),
                       &afStack_1750[0].config.encryption_key,unaff_R13._M_i,unaff_RBP,sVar4,
                       acStack_1850,sVar5);
        fdb_set(pfStack_19b8,(fdb_doc *)(&afStack_1750[0].bub_ctx.handle)[uVar9]);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 8;
      } while (uVar9 != 100);
      fdb_commit((fdb_file_handle *)pfStack_19c0,'\0');
      fdb_get_kvs_info(pfStack_19b8,&fStack_1988);
      if ((filemgr *)fStack_1988.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar8 = 0;
      pfVar7 = (fdb_kvs_handle *)&plStack_19b0;
      do {
        fdb_del(pfStack_19b8,(fdb_doc *)(&afStack_1750[0].bub_ctx.handle)[lVar8]);
        if (lVar8 == 0x32) {
          pthread_create((pthread_t *)pfVar7,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_19c0);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 100);
      pthread_join((pthread_t)plStack_19b0,&pvStack_19a8);
      fdb_commit((fdb_file_handle *)pfStack_19c0,'\x01');
      fdb_get_kvs_info(pfStack_19b8,&fStack_1988);
      if ((filemgr *)fStack_1988.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_19b8);
      _Var15._M_i = (__int_type_conflict)&pfStack_19c0;
      fdb_close((fdb_file_handle *)pfStack_19c0);
      fVar2 = fdb_open((fdb_file_handle **)_Var15._M_i,"./compact_test1",&fStack_1948);
      unaff_R12 = (fdb_kvs_handle *)0x64;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var15._M_i = (__int_type_conflict)pfStack_19c0;
      fVar2 = fdb_kvs_open_default((fdb_file_handle *)pfStack_19c0,&pfStack_19b8,&fStack_19a0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_19b8,&fStack_1988);
        if ((filemgr *)fStack_1988.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar8 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_1750[0].bub_ctx.handle)[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 100);
        fdb_kvs_close(pfStack_19b8);
        fdb_close((fdb_file_handle *)pfStack_19c0);
        fdb_shutdown();
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar13,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var15._M_i = (__int_type_conflict)&pfStack_19c0;
    fVar2 = fdb_open((fdb_file_handle **)_Var15._M_i,"./compact_test1",&fStack_1948);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var15._M_i = (__int_type_conflict)pfStack_19c0;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_19c0,(char *)0x0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_19c0);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle_00 = (filemgr *)0x0;
  pfStack_15780 = (fdb_kvs_handle *)0x10fd83;
  auStack_15748._8_8_ = _Var15._M_i;
  gettimeofday(&tStack_155e0,(__timezone_ptr_t)0x0);
  pfStack_15780 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_15780 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar13 = auStack_156e8;
  pfStack_15780 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_15780 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_156e8._8_8_ = 0;
  aStack_156d8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_156c4 = 1;
  uStack_156ba = 0x1e01;
  pfStack_156b0 = (filemgr *)0x1;
  aStack_15670.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ptr_fhandle = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x10fde7;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test",(fdb_config *)pcVar13);
  if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_001108c3;
  aStack_15670.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
  pfStack_15780 = (fdb_kvs_handle *)0x10fe14;
  fdb_open((fdb_file_handle **)auStack_15770,"compact_test",(fdb_config *)auStack_156e8);
  pcVar13 = auStack_15768;
  pfStack_15780 = (fdb_kvs_handle *)0x10fe29;
  fdb_kvs_open_default((fdb_file_handle *)auStack_15770,(fdb_kvs_handle **)pcVar13,&fStack_15738);
  pfStack_15780 = (fdb_kvs_handle *)0x10fe3f;
  ptr_fhandle = (char *)auStack_15768;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15768,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
  pfStack_15780 = (fdb_kvs_handle *)0x10fe53;
  puts("Initialize..");
  unaff_R13._M_i = 0;
  uVar9 = 0;
  do {
    pfStack_15780 = (fdb_kvs_handle *)0x10fe75;
    sprintf(auStack_155d0 + 0x48,"key%04d",uVar9 & 0xffffffff);
    pfStack_15780 = (fdb_kvs_handle *)0x10fe8e;
    sprintf(acStack_15388,"meta%04d",uVar9 & 0xffffffff);
    pfStack_15780 = (fdb_kvs_handle *)0x10fea7;
    sprintf(acStack_15488,"body%04d",uVar9 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(&afStack_15288[0].kvs_config.create_if_missing + unaff_R13._M_i);
    pfStack_15780 = (fdb_kvs_handle *)0x10feba;
    sVar4 = strlen(auStack_155d0 + 0x48);
    unaff_RBP = (fdb_kvs_handle *)(sVar4 + 1);
    pfStack_15780 = (fdb_kvs_handle *)0x10fece;
    sVar4 = strlen(acStack_15388);
    pfVar7 = (fdb_kvs_handle *)(sVar4 + 1);
    pfStack_15780 = (fdb_kvs_handle *)0x10fedf;
    sVar4 = strlen(acStack_15488);
    pfStack_15780 = (fdb_kvs_handle *)0x10ff07;
    fdb_doc_create((fdb_doc **)unaff_R12,auStack_155d0 + 0x48,(size_t)unaff_RBP,acStack_15388,
                   (size_t)pfVar7,acStack_15488,sVar4 + 1);
    pfStack_15780 = (fdb_kvs_handle *)0x10ff19;
    fdb_set((fdb_kvs_handle *)auStack_15768,
            *(fdb_doc **)(&afStack_15288[0].kvs_config.create_if_missing + uVar9 * 8));
    uVar9 = uVar9 + 1;
    unaff_R13._M_i = unaff_R13._M_i + 8;
  } while (uVar9 != 10000);
  pcVar13 = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x10ff3c;
  fdb_commit((fdb_file_handle *)auStack_15770,'\0');
  pfStack_15780 = (fdb_kvs_handle *)0x10ff44;
  fdb_close((fdb_file_handle *)auStack_15770);
  pfStack_15780 = (fdb_kvs_handle *)0x10ff5b;
  ptr_fhandle = pcVar13;
  fVar2 = fdb_open((fdb_file_handle **)pcVar13,"compact_test",(fdb_config *)auStack_156e8);
  ptr_fhandle_00 = (filemgr *)0x2710;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
  pfStack_15780 = (fdb_kvs_handle *)0x10ff77;
  ptr_fhandle = (char *)auStack_15770;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15770,(fdb_kvs_handle **)auStack_15768,&fStack_15738
                    );
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
  pfStack_15780 = (fdb_kvs_handle *)0x10ff97;
  ptr_fhandle = (char *)auStack_15768;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15768,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
  pcVar13 = auStack_155d0;
  pfStack_15780 = (fdb_kvs_handle *)0x10ffb4;
  fdb_get_file_info((fdb_file_handle *)auStack_15770,(fdb_file_info *)pcVar13);
  pfStack_15780 = (fdb_kvs_handle *)0x10ffc3;
  iVar3 = strcmp((char *)auStack_155d0._0_8_,"compact_test");
  if (iVar3 != 0) {
    pfStack_15780 = (fdb_kvs_handle *)0x10ffd4;
    compaction_daemon_test();
  }
  ptr_fhandle_00 = (filemgr *)(auStack_155d0 + 0x48);
  pfVar7 = (fdb_kvs_handle *)auStack_15758;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  _Var15._M_i = unaff_R13._M_i;
  do {
    pfStack_15780 = (fdb_kvs_handle *)0x10fff8;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pfStack_15780 = (fdb_kvs_handle *)0x110000;
    sVar4 = strlen((char *)ptr_fhandle_00);
    pfStack_15780 = (fdb_kvs_handle *)0x11001f;
    fdb_doc_create((fdb_doc **)pfVar7,ptr_fhandle_00,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_15780 = (fdb_kvs_handle *)0x11002e;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_15768,(fdb_doc *)auStack_15758._0_8_);
    unaff_R13._M_i = auStack_15758._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
      pfStack_15780 = (fdb_kvs_handle *)0x1108a3;
      compaction_daemon_test();
      goto LAB_001108a3;
    }
    unaff_RBP = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_15758._0_8_ + 0x40))->
                seqtree;
    pcVar13 = *(char **)(*(long *)(&afStack_15288[0].kvs_config.create_if_missing +
                                  (long)unaff_R12 * 8) + 0x40);
    pfStack_15780 = (fdb_kvs_handle *)0x11005a;
    iVar3 = bcmp(unaff_RBP,pcVar13,(size_t)*(void **)(auStack_15758._0_8_ + 0x10));
    _Var15._M_i = unaff_R13._M_i;
    if (iVar3 != 0) {
      pfStack_15780 = (fdb_kvs_handle *)0x11089e;
      compaction_daemon_test();
      goto LAB_0011089e;
    }
    pfStack_15780 = (fdb_kvs_handle *)0x11006a;
    fdb_doc_free((fdb_doc *)unaff_R13._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pfStack_15780 = (fdb_kvs_handle *)0x11008e;
  ptr_fhandle = (char *)auStack_15768;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_15768,(fdb_kvs_handle **)&aStack_15720,10000);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
  pfStack_15780 = (fdb_kvs_handle *)0x1100a0;
  fdb_kvs_close((fdb_kvs_handle *)aStack_15720.super___atomic_base<unsigned_long>._M_i);
  pcVar13 = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x1100ad;
  fdb_close((fdb_file_handle *)auStack_15770);
  pfStack_15780 = (fdb_kvs_handle *)0x1100b9;
  system("rm -rf  compact_test.meta > errorlog.txt");
  pfStack_15780 = (fdb_kvs_handle *)0x1100d0;
  ptr_fhandle = pcVar13;
  fVar2 = fdb_open((fdb_file_handle **)pcVar13,"compact_test",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
  pfStack_15780 = (fdb_kvs_handle *)0x1100ec;
  ptr_fhandle = (char *)auStack_15770;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15770,(fdb_kvs_handle **)auStack_15768,&fStack_15738
                    );
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
  pfStack_15780 = (fdb_kvs_handle *)0x11010c;
  ptr_fhandle = (char *)auStack_15768;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15768,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
  ptr_fhandle_00 = (filemgr *)(auStack_155d0 + 0x48);
  pfVar7 = (fdb_kvs_handle *)auStack_15758;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_15780 = (fdb_kvs_handle *)0x110138;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pfStack_15780 = (fdb_kvs_handle *)0x110140;
    sVar4 = strlen((char *)ptr_fhandle_00);
    pfStack_15780 = (fdb_kvs_handle *)0x11015f;
    fdb_doc_create((fdb_doc **)pfVar7,ptr_fhandle_00,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_15780 = (fdb_kvs_handle *)0x11016e;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_15768,(fdb_doc *)auStack_15758._0_8_);
    _Var15._M_i = auStack_15758._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
    unaff_RBP = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_15758._0_8_ + 0x40))->
                seqtree;
    pcVar13 = *(char **)(*(long *)(&afStack_15288[0].kvs_config.create_if_missing +
                                  (long)unaff_R12 * 8) + 0x40);
    pfStack_15780 = (fdb_kvs_handle *)0x11019a;
    iVar3 = bcmp(unaff_RBP,pcVar13,(size_t)*(void **)(auStack_15758._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_001108a3;
    pfStack_15780 = (fdb_kvs_handle *)0x1101aa;
    fdb_doc_free((fdb_doc *)_Var15._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
    unaff_R13._M_i = _Var15._M_i;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pcVar13 = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x1101c7;
  fdb_close((fdb_file_handle *)auStack_15770);
  pfStack_15780 = (fdb_kvs_handle *)0x1101d3;
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  pfStack_15780 = (fdb_kvs_handle *)0x1101ea;
  ptr_fhandle = pcVar13;
  fVar2 = fdb_open((fdb_file_handle **)pcVar13,"compact_test",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
  pfStack_15780 = (fdb_kvs_handle *)0x110206;
  ptr_fhandle = (char *)auStack_15770;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15770,(fdb_kvs_handle **)auStack_15768,&fStack_15738
                    );
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
  pfStack_15780 = (fdb_kvs_handle *)0x110226;
  ptr_fhandle = (char *)auStack_15768;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15768,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
  ptr_fhandle_00 = (filemgr *)(auStack_155d0 + 0x48);
  pfVar7 = (fdb_kvs_handle *)auStack_15758;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_15780 = (fdb_kvs_handle *)0x110252;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pfStack_15780 = (fdb_kvs_handle *)0x11025a;
    sVar4 = strlen((char *)ptr_fhandle_00);
    pfStack_15780 = (fdb_kvs_handle *)0x110279;
    fdb_doc_create((fdb_doc **)pfVar7,ptr_fhandle_00,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_15780 = (fdb_kvs_handle *)0x110288;
    ptr_fhandle = (char *)auStack_15768;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_15768,(fdb_doc *)auStack_15758._0_8_);
    _Var15._M_i = auStack_15758._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108be;
    unaff_RBP = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_15758._0_8_ + 0x40))->
                seqtree;
    pcVar13 = *(char **)(*(long *)(&afStack_15288[0].kvs_config.create_if_missing +
                                  (long)unaff_R12 * 8) + 0x40);
    pfStack_15780 = (fdb_kvs_handle *)0x1102b4;
    iVar3 = bcmp(unaff_RBP,pcVar13,(size_t)*(void **)(auStack_15758._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_001108b3;
    pfStack_15780 = (fdb_kvs_handle *)0x1102c4;
    fdb_doc_free((fdb_doc *)_Var15._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
    unaff_R13._M_i = _Var15._M_i;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pfStack_15780 = (fdb_kvs_handle *)0x1102de;
  fdb_close((fdb_file_handle *)auStack_15770);
  ptr_fhandle = auStack_15748;
  pfStack_15780 = (fdb_kvs_handle *)0x1102f7;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_less",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
  pfStack_15780 = (fdb_kvs_handle *)0x110313;
  ptr_fhandle = (char *)auStack_15748._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15748._0_8_,(fdb_kvs_handle **)&aStack_15708.seqtree
                     ,&fStack_15738);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110904;
  uStack_156ba = uStack_156ba & 0xff;
  ptr_fhandle = auStack_15758 + 8;
  pfStack_15780 = (fdb_kvs_handle *)0x110338;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110909;
  pfStack_15780 = (fdb_kvs_handle *)0x110354;
  ptr_fhandle = (char *)auStack_15758._8_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15758._8_8_,(fdb_kvs_handle **)&_Stack_15710,
                     &fStack_15738);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
  uStack_156ba = uStack_156ba & 0xff00;
  ptr_fhandle = auStack_15760;
  pfStack_15780 = (fdb_kvs_handle *)0x110379;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual",(fdb_config *)auStack_156e8
                  );
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110913;
  pfStack_15780 = (fdb_kvs_handle *)0x110395;
  ptr_fhandle = (char *)auStack_15760;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15760,(fdb_kvs_handle **)&aStack_15718.seqtree,
                     &fStack_15738);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110918;
  uStack_156ba = 0x1e01;
  ptr_fhandle = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x1103bc;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
  pfStack_15780 = (fdb_kvs_handle *)0x1103d8;
  ptr_fhandle = (char *)auStack_15770;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15770,(fdb_kvs_handle **)auStack_15768,&fStack_15738
                    );
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110922;
  pfStack_15780 = (fdb_kvs_handle *)0x1103f8;
  ptr_fhandle = (char *)auStack_15768;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15768,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110927;
  _Var15._M_i = 0;
  pfStack_15780 = (fdb_kvs_handle *)0x110416;
  printf("wait for %d seconds..\n");
  pcVar13 = auStack_155f0;
  pfStack_15780 = (fdb_kvs_handle *)0x110428;
  gettimeofday((timeval *)pcVar13,(__timezone_ptr_t)0x0);
  tVar19.tv_usec = auStack_155f0._8_8_;
  tVar19.tv_sec = auStack_155f0._0_8_;
  unaff_R12 = (fdb_kvs_handle *)auStack_156f8;
  while( true ) {
    pfStack_15780 = (fdb_kvs_handle *)0x110449;
    fdb_set((fdb_kvs_handle *)auStack_15768,
            *(fdb_doc **)(&afStack_15288[0].kvs_config.create_if_missing + _Var15._M_i * 8));
    pfStack_15780 = (fdb_kvs_handle *)0x110455;
    fdb_commit((fdb_file_handle *)auStack_15770,'\0');
    if ((ushort)((ushort)((short)_Var15._M_i * 0x5c29) >> 2 | (short)_Var15._M_i * 0x4000) < 0x290)
    {
      pfStack_15780 = (fdb_kvs_handle *)0x11047c;
      fdb_set((fdb_kvs_handle *)aStack_15708.seqtree,
              *(fdb_doc **)(&afStack_15288[0].kvs_config.create_if_missing + _Var15._M_i * 8));
      pfStack_15780 = (fdb_kvs_handle *)0x110488;
      fdb_commit((fdb_file_handle *)auStack_15748._0_8_,'\0');
    }
    pfStack_15780 = (fdb_kvs_handle *)0x11049a;
    fdb_set((fdb_kvs_handle *)_Stack_15710._M_i,
            *(fdb_doc **)(&afStack_15288[0].kvs_config.create_if_missing + _Var15._M_i * 8));
    pfStack_15780 = (fdb_kvs_handle *)0x1104a6;
    fdb_commit((fdb_file_handle *)auStack_15758._8_8_,'\0');
    pfStack_15780 = (fdb_kvs_handle *)0x1104b8;
    fdb_set((fdb_kvs_handle *)aStack_15718.seqtree,
            *(fdb_doc **)(&afStack_15288[0].kvs_config.create_if_missing + _Var15._M_i * 8));
    pfStack_15780 = (fdb_kvs_handle *)0x1104c4;
    fdb_commit((fdb_file_handle *)auStack_15760,'\0');
    pfStack_15780 = (fdb_kvs_handle *)0x1104ce;
    gettimeofday((timeval *)unaff_R12,(__timezone_ptr_t)0x0);
    pfStack_15780 = (fdb_kvs_handle *)0x1104e9;
    tVar18 = _utime_gap(tVar19,(timeval)auStack_156f8);
    if ((ulong)auStack_15748._8_8_ <= (fdb_kvs_handle *)tVar18.tv_sec) break;
    _Var15._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var15._M_i)->kvs_config).field_0x1;
    if ((undefined1 *)_Var15._M_i == (undefined1 *)0x2710) {
      _Var15._M_i = 0;
    }
  }
  pfStack_15780 = (fdb_kvs_handle *)0x110517;
  ptr_fhandle = (char *)auStack_15770;
  fVar2 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_15770,0x3c);
  ptr_fhandle_00 = (filemgr *)auStack_155f0._0_8_;
  pfVar7 = (fdb_kvs_handle *)auStack_155f0._8_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
  pfStack_15780 = (fdb_kvs_handle *)0x11052e;
  ptr_fhandle = (char *)auStack_15770;
  fVar2 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_15770,1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110931;
  pfStack_15780 = (fdb_kvs_handle *)0x110542;
  ptr_fhandle = (char *)auStack_15758._8_8_;
  fVar2 = fdb_compact((fdb_file_handle *)auStack_15758._8_8_,(char *)0x0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110936;
  pfStack_15780 = (fdb_kvs_handle *)0x11055b;
  ptr_fhandle = (char *)auStack_15760;
  fVar2 = fdb_compact((fdb_file_handle *)auStack_15760,"compact_test_manual_compacted");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
  uStack_156ba = uStack_156ba & 0xff00;
  ptr_fhandle = auStack_15700;
  pfStack_15780 = (fdb_kvs_handle *)0x110580;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110940;
  pfStack_15780 = (fdb_kvs_handle *)0x11059c;
  ptr_fhandle = (char *)auStack_15760;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_15760,'\x01',0x1e);
  if (fVar2 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
  pfStack_15780 = (fdb_kvs_handle *)0x1105af;
  fVar2 = fdb_close((fdb_file_handle *)auStack_15700);
  ptr_fhandle = (char *)auStack_15700;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
  pfStack_15780 = (fdb_kvs_handle *)0x1105cb;
  ptr_fhandle = (char *)auStack_15760;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_15760,'\x01',10);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
  pfStack_15780 = (fdb_kvs_handle *)0x1105e7;
  ptr_fhandle = (char *)auStack_15760;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_15760,'\x01',0x1e);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110954;
  pfStack_15780 = (fdb_kvs_handle *)0x1105f9;
  ptr_fhandle = (char *)auStack_15760;
  fVar2 = fdb_close((fdb_file_handle *)auStack_15760);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110959;
  uStack_156ba = CONCAT11(uStack_156ba._1_1_,1);
  ptr_fhandle = auStack_15760;
  pfStack_15780 = (fdb_kvs_handle *)0x11061e;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
  pfStack_15780 = (fdb_kvs_handle *)0x110634;
  ptr_fhandle = (char *)auStack_15758._8_8_;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_15758._8_8_,'\0',0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110963;
  pfStack_15780 = (fdb_kvs_handle *)0x110646;
  ptr_fhandle = (char *)auStack_15758._8_8_;
  fVar2 = fdb_close((fdb_file_handle *)auStack_15758._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110968;
  uStack_156ba = uStack_156ba & 0xff00;
  ptr_fhandle = auStack_15758 + 8;
  pfStack_15780 = (fdb_kvs_handle *)0x11066b;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
  pcVar13 = "compact_test_non.manual";
  pfStack_15780 = (fdb_kvs_handle *)0x110687;
  fdb_compact((fdb_file_handle *)auStack_15758._8_8_,"compact_test_non.manual");
  ptr_fhandle_00 = (filemgr *)auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x110694;
  fdb_close((fdb_file_handle *)auStack_15770);
  pfStack_15780 = (fdb_kvs_handle *)0x11069e;
  fdb_close((fdb_file_handle *)auStack_15748._0_8_);
  pfStack_15780 = (fdb_kvs_handle *)0x1106a8;
  fdb_close((fdb_file_handle *)auStack_15760);
  uStack_156ba = CONCAT11(uStack_156ba._1_1_,1);
  pfStack_15780 = (fdb_kvs_handle *)0x1106bf;
  ptr_fhandle = (char *)ptr_fhandle_00;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle_00,"compact_test_non.manual",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
  ptr_fhandle = "compact_test_non.manual";
  pfStack_15780 = (fdb_kvs_handle *)0x1106dc;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
  uStack_156ba = uStack_156ba & 0xff00;
  ptr_fhandle = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x110702;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
  ptr_fhandle = "compact_test_manual_compacted";
  pfStack_15780 = (fdb_kvs_handle *)0x11071f;
  fVar2 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
  uStack_156ba = CONCAT11(uStack_156ba._1_1_,1);
  ptr_fhandle = "compact_test_manual_compacted";
  pfStack_15780 = (fdb_kvs_handle *)0x110740;
  fVar2 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110986;
  uStack_156ba = uStack_156ba & 0xff00;
  ptr_fhandle = "compact_test_non.manual";
  pfStack_15780 = (fdb_kvs_handle *)0x110760;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
  pfStack_15780 = (fdb_kvs_handle *)0x110773;
  fdb_close((fdb_file_handle *)auStack_15758._8_8_);
  pfStack_15780 = (fdb_kvs_handle *)0x110778;
  fVar2 = fdb_shutdown();
  ptr_fhandle = (char *)auStack_15758._8_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110990;
  ptr_fhandle = "compact_test_non.manual";
  pfStack_15780 = (fdb_kvs_handle *)0x110794;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110995;
  fStack_156c4 = 2;
  ptr_fhandle = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x1107bc;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test_manual_compacted",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
  ptr_fhandle = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x1107de;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test_manual_compacted.meta",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
  ptr_fhandle = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x110800;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
  ptr_fhandle = auStack_15770;
  pfStack_15780 = (fdb_kvs_handle *)0x110822;
  fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                   (fdb_config *)auStack_156e8);
  if (fVar2 == FDB_RESULT_NO_SUCH_FILE) {
    lVar8 = 0;
    do {
      pfStack_15780 = (fdb_kvs_handle *)0x11083a;
      fdb_doc_free(*(fdb_doc **)(&afStack_15288[0].kvs_config.create_if_missing + lVar8 * 8));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 10000);
    pfStack_15780 = (fdb_kvs_handle *)0x11084b;
    fdb_shutdown();
    pfStack_15780 = (fdb_kvs_handle *)0x110850;
    memleak_end();
    pcVar13 = "%s PASSED\n";
    if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    pfStack_15780 = (fdb_kvs_handle *)0x110881;
    fprintf(_stderr,pcVar13,"compaction daemon test");
    return;
  }
  goto LAB_001109a9;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_001108a3:
  pfStack_15780 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  unaff_R13._M_i = _Var15._M_i;
LAB_001108ae:
  _Var15._M_i = unaff_R13._M_i;
  pfStack_15780 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_15780 = (fdb_kvs_handle *)0x1108be;
  ptr_fhandle = pcVar13;
  compaction_daemon_test();
  unaff_R13._M_i = _Var15._M_i;
LAB_001108be:
  pfVar7 = (fdb_kvs_handle *)auStack_15758;
  ptr_fhandle_00 = (filemgr *)(auStack_155d0 + 0x48);
  pfStack_15780 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
LAB_001108c3:
  pfStack_15780 = (fdb_kvs_handle *)0x1108c8;
  compaction_daemon_test();
LAB_001108c8:
  pfStack_15780 = (fdb_kvs_handle *)0x1108cd;
  compaction_daemon_test();
LAB_001108cd:
  pfStack_15780 = (fdb_kvs_handle *)0x1108d2;
  compaction_daemon_test();
LAB_001108d2:
  pfStack_15780 = (fdb_kvs_handle *)0x1108d7;
  compaction_daemon_test();
LAB_001108d7:
  pfStack_15780 = (fdb_kvs_handle *)0x1108dc;
  compaction_daemon_test();
LAB_001108dc:
  pfStack_15780 = (fdb_kvs_handle *)0x1108e1;
  compaction_daemon_test();
LAB_001108e1:
  pfStack_15780 = (fdb_kvs_handle *)0x1108e6;
  compaction_daemon_test();
LAB_001108e6:
  pfStack_15780 = (fdb_kvs_handle *)0x1108eb;
  compaction_daemon_test();
  _Var15._M_i = unaff_R13._M_i;
LAB_001108eb:
  pfStack_15780 = (fdb_kvs_handle *)0x1108f0;
  compaction_daemon_test();
LAB_001108f0:
  pfStack_15780 = (fdb_kvs_handle *)0x1108f5;
  compaction_daemon_test();
LAB_001108f5:
  pfStack_15780 = (fdb_kvs_handle *)0x1108fa;
  compaction_daemon_test();
LAB_001108fa:
  pfStack_15780 = (fdb_kvs_handle *)0x1108ff;
  compaction_daemon_test();
LAB_001108ff:
  pfStack_15780 = (fdb_kvs_handle *)0x110904;
  compaction_daemon_test();
LAB_00110904:
  pfStack_15780 = (fdb_kvs_handle *)0x110909;
  compaction_daemon_test();
LAB_00110909:
  pfStack_15780 = (fdb_kvs_handle *)0x11090e;
  compaction_daemon_test();
LAB_0011090e:
  pfStack_15780 = (fdb_kvs_handle *)0x110913;
  compaction_daemon_test();
LAB_00110913:
  pfStack_15780 = (fdb_kvs_handle *)0x110918;
  compaction_daemon_test();
LAB_00110918:
  pfStack_15780 = (fdb_kvs_handle *)0x11091d;
  compaction_daemon_test();
LAB_0011091d:
  pfStack_15780 = (fdb_kvs_handle *)0x110922;
  compaction_daemon_test();
LAB_00110922:
  pfStack_15780 = (fdb_kvs_handle *)0x110927;
  compaction_daemon_test();
LAB_00110927:
  pfStack_15780 = (fdb_kvs_handle *)0x11092c;
  compaction_daemon_test();
LAB_0011092c:
  pfStack_15780 = (fdb_kvs_handle *)0x110931;
  compaction_daemon_test();
LAB_00110931:
  pfStack_15780 = (fdb_kvs_handle *)0x110936;
  compaction_daemon_test();
LAB_00110936:
  pfStack_15780 = (fdb_kvs_handle *)0x11093b;
  compaction_daemon_test();
LAB_0011093b:
  pfStack_15780 = (fdb_kvs_handle *)0x110940;
  compaction_daemon_test();
LAB_00110940:
  pfStack_15780 = (fdb_kvs_handle *)0x110945;
  compaction_daemon_test();
LAB_00110945:
  pfStack_15780 = (fdb_kvs_handle *)0x11094a;
  compaction_daemon_test();
LAB_0011094a:
  pfStack_15780 = (fdb_kvs_handle *)0x11094f;
  compaction_daemon_test();
LAB_0011094f:
  pfStack_15780 = (fdb_kvs_handle *)0x110954;
  compaction_daemon_test();
LAB_00110954:
  pfStack_15780 = (fdb_kvs_handle *)0x110959;
  compaction_daemon_test();
LAB_00110959:
  pfStack_15780 = (fdb_kvs_handle *)0x11095e;
  compaction_daemon_test();
LAB_0011095e:
  pfStack_15780 = (fdb_kvs_handle *)0x110963;
  compaction_daemon_test();
LAB_00110963:
  pfStack_15780 = (fdb_kvs_handle *)0x110968;
  compaction_daemon_test();
LAB_00110968:
  pfStack_15780 = (fdb_kvs_handle *)0x11096d;
  compaction_daemon_test();
LAB_0011096d:
  pfStack_15780 = (fdb_kvs_handle *)0x110972;
  compaction_daemon_test();
LAB_00110972:
  pfStack_15780 = (fdb_kvs_handle *)0x110977;
  compaction_daemon_test();
LAB_00110977:
  pfStack_15780 = (fdb_kvs_handle *)0x11097c;
  compaction_daemon_test();
LAB_0011097c:
  pfStack_15780 = (fdb_kvs_handle *)0x110981;
  compaction_daemon_test();
LAB_00110981:
  pfStack_15780 = (fdb_kvs_handle *)0x110986;
  compaction_daemon_test();
LAB_00110986:
  pfStack_15780 = (fdb_kvs_handle *)0x11098b;
  compaction_daemon_test();
LAB_0011098b:
  pfStack_15780 = (fdb_kvs_handle *)0x110990;
  compaction_daemon_test();
LAB_00110990:
  pfStack_15780 = (fdb_kvs_handle *)0x110995;
  compaction_daemon_test();
LAB_00110995:
  pfStack_15780 = (fdb_kvs_handle *)0x11099a;
  compaction_daemon_test();
LAB_0011099a:
  pfStack_15780 = (fdb_kvs_handle *)0x11099f;
  compaction_daemon_test();
LAB_0011099f:
  pfStack_15780 = (fdb_kvs_handle *)0x1109a4;
  compaction_daemon_test();
LAB_001109a4:
  pfStack_15780 = (fdb_kvs_handle *)0x1109a9;
  compaction_daemon_test();
LAB_001109a9:
  pfStack_15780 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_15918 = (fdb_kvs_handle *)0x1109ce;
  pfStack_157a8 = (filemgr *)pcVar13;
  pfStack_157a0 = unaff_R12;
  pfStack_15798 = (fdb_kvs_handle *)_Var15._M_i;
  pfStack_15790 = ptr_fhandle_00;
  pfStack_15788 = pfVar7;
  pfStack_15780 = unaff_RBP;
  gettimeofday(&tStack_158c8,(__timezone_ptr_t)0x0);
  pfStack_15918 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_15918 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_15918 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_15872 = 1;
  uStack_15868._0_2_ = 1;
  uStack_15868._2_2_ = 0;
  uStack_15868._4_4_ = 0;
  pfStack_15918 = (fdb_kvs_handle *)0x110a0d;
  fVar2 = fdb_open(&pfStack_15908,"compact_test",(fdb_config *)(auStack_158b8 + 0x18));
  pfVar16 = (fdb_config *)(auStack_158b8 + 0x18);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar16 = (fdb_config *)auStack_158b8;
    pfStack_15918 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_15918 = (fdb_kvs_handle *)0x110a34;
    fVar2 = fdb_kvs_open_default(pfStack_15908,&pfStack_15900,(fdb_kvs_config *)pfVar16);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_15918 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_158d8,(__timezone_ptr_t)0x0);
    pfStack_15918 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)ptr_fhandle & 0xffffffff);
    tVar18.tv_usec = tStack_158d8.tv_usec;
    tVar18.tv_sec = tStack_158d8.tv_sec;
    _Var15._M_i = (long)&atStack_158f8[1].tv_sec + 1;
    unaff_RBP = (fdb_kvs_handle *)0x0;
    do {
      iVar3 = (int)unaff_RBP;
      pfStack_15918 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var15._M_i,"%d",unaff_RBP);
      unaff_R12 = pfStack_15900;
      pfStack_15918 = (fdb_kvs_handle *)0x110a89;
      sVar4 = strlen((char *)_Var15._M_i);
      pfStack_15918 = (fdb_kvs_handle *)0x110aa4;
      fVar2 = fdb_set_kv(unaff_R12,(void *)_Var15._M_i,sVar4,"value",5);
      pfVar16 = (fdb_config *)tStack_158d8.tv_sec;
      pfVar7 = (fdb_kvs_handle *)tStack_158d8.tv_usec;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_15918 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_15918 = (fdb_kvs_handle *)0x110ab8;
      fVar2 = fdb_commit(pfStack_15908,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_15918 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_15918 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_158f8,(__timezone_ptr_t)0x0);
      pfStack_15918 = (fdb_kvs_handle *)0x110ae1;
      tVar19 = _utime_gap(tVar18,atStack_158f8[0]);
    } while (((filemgr *)tVar19.tv_sec < ptr_fhandle) &&
            (unaff_RBP = (fdb_kvs_handle *)(ulong)(iVar3 + 1), iVar3 != 99999));
    pfStack_15918 = (fdb_kvs_handle *)0x110b01;
    fVar2 = fdb_close(pfStack_15908);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_15918 = (fdb_kvs_handle *)0x110b0a;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_15918 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_15918 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar13,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_15918 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_15918 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_15918 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_15918 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_15940 = (filemgr *)ptr_fhandle;
  pfStack_15938 = unaff_R12;
  pfStack_15930 = (fdb_kvs_handle *)_Var15._M_i;
  pfStack_15928 = pfVar16;
  pfStack_15920 = pfVar7;
  pfStack_15918 = unaff_RBP;
  gettimeofday(&tStack_15c48,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_15cb8._32_8_ = (btree *)0x0;
  auStack_15cb8._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_15a38.wal_threshold = 0x1000;
  fStack_15a38.compaction_mode = '\x01';
  fStack_15a38.compaction_threshold = '\n';
  fStack_15a38.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14d0c5;
  pfVar7 = (fdb_kvs_handle *)&pfStack_15cd8;
  kvs_config_01 = (fdb_file_info *)0x1;
  fVar2 = fdb_open_custom_cmp((fdb_file_handle **)pfVar7,"compact_test",&fStack_15a38,1,
                              (char **)(auStack_15cb8 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_15cb8 + 0x18),(void **)0x0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_15cb8._16_8_ = afStack_15c38[0].doc_count;
    auStack_15cb8._0_8_ = afStack_15c38[0].filename;
    auStack_15cb8._8_8_ = afStack_15c38[0].new_filename;
    info_00 = (fdb_file_info *)auStack_15cd0;
    pfVar7 = pfStack_15cd8;
    fVar2 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_15cd8,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_15cb8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info_00 = (fdb_file_info *)auStack_15cc0;
    kvs_config_01 = (fdb_file_info *)auStack_15cb8;
    pfVar7 = pfStack_15cd8;
    fVar2 = fdb_kvs_open((fdb_file_handle *)pfStack_15cd8,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar9 = 0;
    do {
      sprintf((char *)afStack_15c38,"key%06d",uVar9);
      sprintf((char *)afStack_15b38,"body%06d",uVar9);
      pfVar7 = (fdb_kvs_handle *)auStack_15cd0._0_8_;
      sVar4 = strlen((char *)afStack_15c38);
      sVar5 = strlen((char *)afStack_15b38);
      kvs_config_01 = afStack_15b38;
      info_00 = afStack_15c38;
      fVar2 = fdb_set_kv(pfVar7,afStack_15c38,sVar4,afStack_15b38,sVar5);
      handle = auStack_15cc0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar4 = strlen((char *)afStack_15c38);
      sVar5 = strlen((char *)afStack_15b38);
      kvs_config_01 = afStack_15b38;
      info_00 = afStack_15c38;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_15c38,sVar4,afStack_15b38,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar7 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar11 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar11;
    } while (uVar11 != 10000);
    kvs_config_01 = (fdb_file_info *)auStack_15cb8;
    auStack_15cb8._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_15cd0 + 8);
    pfVar7 = pfStack_15cd8;
    fVar2 = fdb_kvs_open((fdb_file_handle *)pfStack_15cd8,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info_00 = afStack_15c38;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_01 = afStack_15b38;
    sprintf((char *)kvs_config_01,"body%06d",0);
    sVar4 = strlen((char *)info_00);
    sVar5 = strlen((char *)kvs_config_01);
    fVar2 = fdb_set_kv((fdb_kvs_handle *)auStack_15cd0._8_8_,info_00,sVar4,kvs_config_01,sVar5);
    pfVar7 = (fdb_kvs_handle *)auStack_15cd0._8_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info_00 = (fdb_file_info *)0x0;
    pfVar7 = pfStack_15cd8;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_15cd8,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar9 = 0;
    uVar17 = 0;
    do {
      sprintf((char *)afStack_15c38,"key%06d",uVar17);
      sprintf((char *)afStack_15b38,"body%06d",uVar17);
      pfVar7 = (fdb_kvs_handle *)auStack_15cd0._0_8_;
      sVar4 = strlen((char *)afStack_15c38);
      sVar5 = strlen((char *)afStack_15b38);
      kvs_config_01 = afStack_15b38;
      info_00 = afStack_15c38;
      fVar2 = fdb_set_kv(pfVar7,afStack_15c38,sVar4,afStack_15b38,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info_00 = (fdb_file_info *)(auStack_15cb8 + 0x28);
      pfVar7 = pfStack_15cd8;
      fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15cd8,info_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar9 < uStack_15c68) {
        uVar9 = uStack_15c68;
      }
      uVar11 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar11;
    } while (uVar11 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar7 = pfStack_15cd8;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_15cd8,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info_00 = (fdb_file_info *)(auStack_15cb8 + 0x28);
    pfVar7 = pfStack_15cd8;
    fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15cd8,info_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar9 < uStack_15c68) {
      uVar9 = uStack_15c68;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar9);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_15cb8 + 0x28);
      pfVar7 = pfStack_15cd8;
      fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15cd8,
                                (fdb_file_info *)(auStack_15cb8 + 0x28));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar9 <= uStack_15c68);
    fVar2 = fdb_close((fdb_file_handle *)pfStack_15cd8);
    pfVar7 = pfStack_15cd8;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_shutdown();
      pfVar7 = pfStack_15cd8;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar13,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_01) {
    memcmp(pfVar7,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_01) {
    kvs_config_01 = info_00;
  }
  memcmp(pfVar7,__s2,(size_t)kvs_config_01);
  return;
}

Assistant:

void auto_recover_compact_ok_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile, *dbfile_new;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_new;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert first two documents
    for (i=0;i<2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove second doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // save the old file after compaction is done ..
    r = system(SHELL_COPY " compact_test1 compact_test11 > errorlog.txt");
    (void)r;

    // now insert third doc: it should go to the newly compacted file.
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "body%d", i);
    fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
        (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[i]);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close both the db files ...
    fdb_kvs_close(db);
    fdb_kvs_close(db_new);
    fdb_close(dbfile);
    fdb_close(dbfile_new);

    // restore the old file after close is done ..
    r = system(SHELL_MOVE " compact_test11 compact_test1 > errorlog.txt");
    (void)r;

    // now open the old saved compacted file, it should automatically recover
    // and use the new file since compaction was done successfully
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents using the old handle and expect all 3 docs
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db_new, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check this handle's filename it should point to newly compacted file
    fdb_file_info info;
    fdb_get_file_info(dbfile_new, &info);
    TEST_CHK(!strcmp("./compact_test2", info.filename));

    // close the file
    fdb_kvs_close(db_new);
    fdb_close(dbfile_new);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("auto recovery after compaction test");
}